

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O2

int __thiscall pstore::file::file_handle::open(file_handle *this,char *__file,int __oflag,...)

{
  int iVar1;
  pointer_based_iterator<char> pVar2;
  int *piVar3;
  string path;
  small_vector<char,_256UL> buffer;
  allocator local_181;
  string local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  small_vector<char,_256UL> local_140;
  
  close(this,(int)__file);
  std::__cxx11::string::string((string *)&local_140,"pst-XXXXXX",&local_181);
  pstore::path::posix::join(&local_180,(string *)__file,(string *)&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  small_vector<char,_256UL>::small_vector(&local_140,local_180._M_string_length + 1);
  pVar2 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char_const*,pstore::pointer_based_iterator<char>>
                    (local_180._M_dataplus._M_p,
                     local_180._M_dataplus._M_p + local_180._M_string_length,
                     (pointer_based_iterator<char>)local_140.buffer_);
  *pVar2.pos_ = '\0';
  iVar1 = mkstemp(local_140.buffer_);
  this->file_ = iVar1;
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  std::__cxx11::string::assign((char *)&this->path_);
  this->is_writable_ = true;
  if (this->file_ != -1) {
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&local_140.big_buffer_.super__Vector_base<char,_std::allocator<char>_>);
    iVar1 = std::__cxx11::string::~string((string *)&local_180);
    return iVar1;
  }
  std::__cxx11::string::string((string *)&local_160,(string *)__file);
  (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
            (iVar1,"Unable to create unique file in directory",&local_160);
}

Assistant:

void file_handle::open (unique const, std::string const & directory) {
            this->close ();

            std::string const path = path::join (directory, "pst-XXXXXX");

            // mkstemp() modifies its input parameter so that on return it contains
            // the actual name of the temporary file that was created.
            small_vector<char> buffer (path.length () + 1);
            auto out = std::copy (std::begin (path), std::end (path), std::begin (buffer));
            *out = '\0';

            file_ = ::mkstemp (buffer.data ());
            int const err = errno;
            path_ = buffer.data ();
            is_writable_ = true;
            if (file_ == -1) {
                raise_file_error (err, "Unable to create unique file in directory", directory);
            }
        }